

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

int Lpk_NodeCutsOneFilter(Lpk_Cut_t *pCuts,int nCuts,Lpk_Cut_t *pCutNew)

{
  int iVar1;
  Lpk_Cut_t *pCut_00;
  uint local_38;
  int local_34;
  int k;
  int i;
  Lpk_Cut_t *pCut;
  Lpk_Cut_t *pCutNew_local;
  int nCuts_local;
  Lpk_Cut_t *pCuts_local;
  
  if ((pCutNew->uSign[0] == 0) && (pCutNew->uSign[1] == 0)) {
    __assert_fail("pCutNew->uSign[0] || pCutNew->uSign[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCut.c"
                  ,0x16e,"int Lpk_NodeCutsOneFilter(Lpk_Cut_t *, int, Lpk_Cut_t *)");
  }
  local_34 = 0;
  do {
    if (nCuts <= local_34) {
      return 0;
    }
    pCut_00 = pCuts + local_34;
    if (((undefined1  [820])*pCut_00 & (undefined1  [820])0x3f) != (undefined1  [820])0x0) {
      if ((*(uint *)pCut_00 & 0x3f) == (*(uint *)pCutNew & 0x3f)) {
        if ((pCut_00->uSign[0] == pCutNew->uSign[0]) && (pCut_00->uSign[1] == pCutNew->uSign[1])) {
          for (local_38 = 0;
              ((int)local_38 < (int)(*(uint *)pCutNew & 0x3f) &&
              (pCut_00->pLeaves[(int)local_38] == pCutNew->pLeaves[(int)local_38]));
              local_38 = local_38 + 1) {
          }
          if (local_38 == (*(uint *)pCutNew & 0x3f)) {
            return 1;
          }
        }
      }
      else if ((*(uint *)pCut_00 & 0x3f) < (*(uint *)pCutNew & 0x3f)) {
        if ((((pCut_00->uSign[0] & pCutNew->uSign[0]) == pCut_00->uSign[0]) &&
            ((pCut_00->uSign[1] & pCutNew->uSign[1]) == pCut_00->uSign[1])) &&
           (iVar1 = Lpk_NodeCutsOneDominance(pCut_00,pCutNew), iVar1 != 0)) {
          return 1;
        }
      }
      else if ((((pCut_00->uSign[0] & pCutNew->uSign[0]) == pCutNew->uSign[0]) &&
               ((pCut_00->uSign[1] & pCutNew->uSign[1]) == pCutNew->uSign[1])) &&
              (iVar1 = Lpk_NodeCutsOneDominance(pCutNew,pCut_00), iVar1 != 0)) {
        *(uint *)pCut_00 = *(uint *)pCut_00 & 0xffffffc0;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int Lpk_NodeCutsOneFilter( Lpk_Cut_t * pCuts, int nCuts, Lpk_Cut_t * pCutNew )
{
    Lpk_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uSign[0] || pCutNew->uSign[1] );
    // try to find the cut
    for ( i = 0; i < nCuts; i++ )
    {
        pCut = pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;
        if ( pCut->nLeaves == pCutNew->nLeaves )
        {
            if ( pCut->uSign[0] == pCutNew->uSign[0] && pCut->uSign[1] == pCutNew->uSign[1] )
            {
                for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
                    if ( pCut->pLeaves[k] != pCutNew->pLeaves[k] )
                        break;
                if ( k == (int)pCutNew->nLeaves )
                    return 1;
            }
            continue;
        }
        if ( pCut->nLeaves < pCutNew->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCut->uSign[0] )
                continue;
            if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCut->uSign[1] )
                continue;
            // check containment seriously
            if ( Lpk_NodeCutsOneDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCutNew->uSign[0] )
            continue;
        if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCutNew->uSign[1] )
            continue;
        // check containment seriously
        if ( Lpk_NodeCutsOneDominance( pCutNew, pCut ) )
            pCut->nLeaves = 0; // removed
    }
    return 0;
}